

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QCss::StyleSheet>::emplace<QCss::StyleSheet_const&>
          (QMovableArrayOps<QCss::StyleSheet> *this,qsizetype i,StyleSheet *args)

{
  StyleSheet **ppSVar1;
  qsizetype *pqVar2;
  StyleSheet *pSVar3;
  Data *pDVar4;
  StyleSheet *pSVar5;
  Data *pDVar6;
  Data *pDVar7;
  Data *pDVar8;
  Data *pDVar9;
  Data *pDVar10;
  Data *pDVar11;
  int iVar12;
  long in_FS_OFFSET;
  bool bVar13;
  QArrayDataPointer<QCss::StyleRule> local_d8;
  QArrayDataPointer<QCss::MediaRule> local_c0;
  QArrayDataPointer<QCss::PageRule> local_a8;
  QArrayDataPointer<QCss::AnimationRule> local_90;
  QArrayDataPointer<QCss::ImportRule> local_78;
  undefined8 local_60;
  QMultiHash<QString,_QCss::StyleRule> local_58;
  QMultiHash<QString,_QCss::StyleRule> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QCss::StyleSheet>).
           super_QArrayDataPointer<QCss::StyleSheet>.d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_00517f22:
    memset(&local_c0,0xaa,0x88);
    local_d8.d = (args->styleRules).d.d;
    local_d8.ptr = (args->styleRules).d.ptr;
    local_d8.size = (args->styleRules).d.size;
    if (local_d8.d != (Data *)0x0) {
      LOCK();
      ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_c0.d = (args->mediaRules).d.d;
    local_c0.ptr = (args->mediaRules).d.ptr;
    local_c0.size = (args->mediaRules).d.size;
    if (local_c0.d != (Data *)0x0) {
      LOCK();
      ((local_c0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_a8.d = (args->pageRules).d.d;
    local_a8.ptr = (args->pageRules).d.ptr;
    local_a8.size = (args->pageRules).d.size;
    if (local_a8.d != (Data *)0x0) {
      LOCK();
      ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_90.d = (args->animationRules).d.d;
    local_90.ptr = (args->animationRules).d.ptr;
    local_90.size = (args->animationRules).d.size;
    if (local_90.d != (Data *)0x0) {
      LOCK();
      ((local_90.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_78.d = (args->importRules).d.d;
    local_78.ptr = (args->importRules).d.ptr;
    local_78.size = (args->importRules).d.size;
    if (local_78.d != (Data *)0x0) {
      LOCK();
      ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_60._0_4_ = args->origin;
    local_60._4_4_ = args->depth;
    local_58.d = (args->nameIndex).d;
    local_58.m_size = (args->nameIndex).m_size;
    if ((local_58.d != (Data *)0x0) &&
       (((local_58.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
      LOCK();
      ((local_58.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_48.d = (args->idIndex).d;
    local_48.m_size = (args->idIndex).m_size;
    if ((local_48.d != (Data *)0x0) &&
       (((local_48.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
      LOCK();
      ((local_48.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar13 = (this->super_QGenericArrayOps<QCss::StyleSheet>).
             super_QArrayDataPointer<QCss::StyleSheet>.size != 0;
    QArrayDataPointer<QCss::StyleSheet>::detachAndGrow
              ((QArrayDataPointer<QCss::StyleSheet> *)this,(uint)(i == 0 && bVar13),1,
               (StyleSheet **)0x0,(QArrayDataPointer<QCss::StyleSheet> *)0x0);
    pSVar5 = (this->super_QGenericArrayOps<QCss::StyleSheet>).
             super_QArrayDataPointer<QCss::StyleSheet>.ptr;
    if (i == 0 && bVar13) {
      pSVar5[-1].styleRules.d.d = local_d8.d;
      pSVar5[-1].styleRules.d.ptr = local_d8.ptr;
      pSVar5[-1].styleRules.d.size = local_d8.size;
      pSVar5[-1].mediaRules.d.d = local_c0.d;
      pSVar5[-1].mediaRules.d.ptr = local_c0.ptr;
      pSVar5[-1].mediaRules.d.size = local_c0.size;
      pSVar5[-1].pageRules.d.d = local_a8.d;
      pSVar5[-1].pageRules.d.ptr = local_a8.ptr;
      pSVar5[-1].pageRules.d.size = local_a8.size;
      pSVar5[-1].animationRules.d.d = local_90.d;
      pSVar5[-1].animationRules.d.ptr = local_90.ptr;
      pSVar5[-1].animationRules.d.size = local_90.size;
      pSVar5[-1].importRules.d.d = local_78.d;
      pSVar5[-1].importRules.d.ptr = local_78.ptr;
      pSVar5[-1].importRules.d.size = local_78.size;
      pSVar5[-1].origin = (undefined4)local_60;
      pSVar5[-1].depth = local_60._4_4_;
      pSVar5[-1].nameIndex.d = local_58.d;
      pSVar5[-1].nameIndex.m_size = local_58.m_size;
      pSVar5[-1].idIndex.d = local_48.d;
      pSVar5[-1].idIndex.m_size = local_48.m_size;
      ppSVar1 = &(this->super_QGenericArrayOps<QCss::StyleSheet>).
                 super_QArrayDataPointer<QCss::StyleSheet>.ptr;
      *ppSVar1 = *ppSVar1 + -1;
    }
    else {
      pSVar3 = pSVar5 + i;
      memmove(pSVar3 + 1,pSVar5 + i,
              ((this->super_QGenericArrayOps<QCss::StyleSheet>).
               super_QArrayDataPointer<QCss::StyleSheet>.size - i) * 0xa0);
      (pSVar3->styleRules).d.d = local_d8.d;
      (pSVar3->styleRules).d.ptr = local_d8.ptr;
      (pSVar3->styleRules).d.size = local_d8.size;
      (pSVar3->mediaRules).d.d = local_c0.d;
      (pSVar3->mediaRules).d.ptr = local_c0.ptr;
      (pSVar3->mediaRules).d.size = local_c0.size;
      (pSVar3->pageRules).d.d = local_a8.d;
      (pSVar3->pageRules).d.ptr = local_a8.ptr;
      (pSVar3->pageRules).d.size = local_a8.size;
      (pSVar3->animationRules).d.d = local_90.d;
      (pSVar3->animationRules).d.ptr = local_90.ptr;
      (pSVar3->animationRules).d.size = local_90.size;
      (pSVar3->importRules).d.d = local_78.d;
      (pSVar3->importRules).d.ptr = local_78.ptr;
      (pSVar3->importRules).d.size = local_78.size;
      pSVar3->origin = (undefined4)local_60;
      pSVar3->depth = local_60._4_4_;
      (pSVar3->nameIndex).d = local_58.d;
      (pSVar3->nameIndex).m_size = local_58.m_size;
      (pSVar3->idIndex).d = local_48.d;
      (pSVar3->idIndex).m_size = local_48.m_size;
    }
    local_48.m_size = 0;
    local_48.d = (Data *)0x0;
    local_58.m_size = 0;
    local_58.d = (Data *)0x0;
    local_78.size = 0;
    local_78.ptr = (ImportRule *)0x0;
    local_78.d = (Data *)0x0;
    local_90.size = 0;
    local_90.ptr = (AnimationRule *)0x0;
    local_90.d = (Data *)0x0;
    local_a8.size = 0;
    local_a8.ptr = (PageRule *)0x0;
    local_a8.d = (Data *)0x0;
    local_c0.size = 0;
    local_c0.ptr = (MediaRule *)0x0;
    local_c0.d = (Data *)0x0;
    local_d8.size = 0;
    local_d8.ptr = (StyleRule *)0x0;
    local_d8.d = (Data *)0x0;
    pqVar2 = &(this->super_QGenericArrayOps<QCss::StyleSheet>).
              super_QArrayDataPointer<QCss::StyleSheet>.size;
    *pqVar2 = *pqVar2 + 1;
    QMultiHash<QString,_QCss::StyleRule>::~QMultiHash(&local_48);
    QMultiHash<QString,_QCss::StyleRule>::~QMultiHash(&local_58);
    QArrayDataPointer<QCss::ImportRule>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<QCss::AnimationRule>::~QArrayDataPointer(&local_90);
    QArrayDataPointer<QCss::PageRule>::~QArrayDataPointer(&local_a8);
    QArrayDataPointer<QCss::MediaRule>::~QArrayDataPointer(&local_c0);
    QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer(&local_d8);
  }
  else {
    if (((this->super_QGenericArrayOps<QCss::StyleSheet>).super_QArrayDataPointer<QCss::StyleSheet>.
         size == i) &&
       (pSVar5 = (this->super_QGenericArrayOps<QCss::StyleSheet>).
                 super_QArrayDataPointer<QCss::StyleSheet>.ptr,
       (pDVar4->super_QArrayData).alloc - i !=
       ((long)((long)pSVar5 -
              ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 5) *
       -0x3333333333333333)) {
      pDVar6 = (args->styleRules).d.d;
      pSVar5[i].styleRules.d.d = pDVar6;
      pSVar5[i].styleRules.d.ptr = (args->styleRules).d.ptr;
      pSVar5[i].styleRules.d.size = (args->styleRules).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar7 = (args->mediaRules).d.d;
      pSVar5[i].mediaRules.d.d = pDVar7;
      pSVar5[i].mediaRules.d.ptr = (args->mediaRules).d.ptr;
      pSVar5[i].mediaRules.d.size = (args->mediaRules).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar8 = (args->pageRules).d.d;
      pSVar5[i].pageRules.d.d = pDVar8;
      pSVar5[i].pageRules.d.ptr = (args->pageRules).d.ptr;
      pSVar5[i].pageRules.d.size = (args->pageRules).d.size;
      if (pDVar8 != (Data *)0x0) {
        LOCK();
        (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar9 = (args->animationRules).d.d;
      pSVar5[i].animationRules.d.d = pDVar9;
      pSVar5[i].animationRules.d.ptr = (args->animationRules).d.ptr;
      pSVar5[i].animationRules.d.size = (args->animationRules).d.size;
      if (pDVar9 != (Data *)0x0) {
        LOCK();
        (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar10 = (args->importRules).d.d;
      pSVar5[i].importRules.d.d = pDVar10;
      pSVar5[i].importRules.d.ptr = (args->importRules).d.ptr;
      pSVar5[i].importRules.d.size = (args->importRules).d.size;
      if (pDVar10 != (Data *)0x0) {
        LOCK();
        (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      iVar12 = args->depth;
      pSVar5[i].origin = args->origin;
      pSVar5[i].depth = iVar12;
      pDVar11 = (args->nameIndex).d;
      pSVar5[i].nameIndex.d = pDVar11;
      pSVar5[i].nameIndex.m_size = (args->nameIndex).m_size;
      if ((pDVar11 != (Data *)0x0) &&
         ((pDVar11->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
        LOCK();
        (pDVar11->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar11->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar11 = (args->idIndex).d;
      pSVar5[i].idIndex.d = pDVar11;
      pSVar5[i].idIndex.m_size = (args->idIndex).m_size;
      if ((pDVar11 != (Data *)0x0) &&
         ((pDVar11->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
        LOCK();
        (pDVar11->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar11->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      if ((i != 0) ||
         (pSVar5 = (this->super_QGenericArrayOps<QCss::StyleSheet>).
                   super_QArrayDataPointer<QCss::StyleSheet>.ptr,
         (StyleSheet *)((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
         == pSVar5)) goto LAB_00517f22;
      pDVar6 = (args->styleRules).d.d;
      pSVar5[-1].styleRules.d.d = pDVar6;
      pSVar5[-1].styleRules.d.ptr = (args->styleRules).d.ptr;
      pSVar5[-1].styleRules.d.size = (args->styleRules).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar7 = (args->mediaRules).d.d;
      pSVar5[-1].mediaRules.d.d = pDVar7;
      pSVar5[-1].mediaRules.d.ptr = (args->mediaRules).d.ptr;
      pSVar5[-1].mediaRules.d.size = (args->mediaRules).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar8 = (args->pageRules).d.d;
      pSVar5[-1].pageRules.d.d = pDVar8;
      pSVar5[-1].pageRules.d.ptr = (args->pageRules).d.ptr;
      pSVar5[-1].pageRules.d.size = (args->pageRules).d.size;
      if (pDVar8 != (Data *)0x0) {
        LOCK();
        (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar9 = (args->animationRules).d.d;
      pSVar5[-1].animationRules.d.d = pDVar9;
      pSVar5[-1].animationRules.d.ptr = (args->animationRules).d.ptr;
      pSVar5[-1].animationRules.d.size = (args->animationRules).d.size;
      if (pDVar9 != (Data *)0x0) {
        LOCK();
        (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar10 = (args->importRules).d.d;
      pSVar5[-1].importRules.d.d = pDVar10;
      pSVar5[-1].importRules.d.ptr = (args->importRules).d.ptr;
      pSVar5[-1].importRules.d.size = (args->importRules).d.size;
      if (pDVar10 != (Data *)0x0) {
        LOCK();
        (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      iVar12 = args->depth;
      pSVar5[-1].origin = args->origin;
      pSVar5[-1].depth = iVar12;
      pDVar11 = (args->nameIndex).d;
      pSVar5[-1].nameIndex.d = pDVar11;
      pSVar5[-1].nameIndex.m_size = (args->nameIndex).m_size;
      if ((pDVar11 != (Data *)0x0) &&
         ((pDVar11->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
        LOCK();
        (pDVar11->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar11->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar11 = (args->idIndex).d;
      pSVar5[-1].idIndex.d = pDVar11;
      pSVar5[-1].idIndex.m_size = (args->idIndex).m_size;
      if ((pDVar11 != (Data *)0x0) &&
         ((pDVar11->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
        LOCK();
        (pDVar11->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar11->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ppSVar1 = &(this->super_QGenericArrayOps<QCss::StyleSheet>).
                 super_QArrayDataPointer<QCss::StyleSheet>.ptr;
      *ppSVar1 = *ppSVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QCss::StyleSheet>).
              super_QArrayDataPointer<QCss::StyleSheet>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }